

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShoppingRushSolution.cpp
# Opt level: O1

int shopping<std::multiset<std::pair<ToyStoreProduct,int>,std::less<std::pair<ToyStoreProduct,int>>,std::allocator<std::pair<ToyStoreProduct,int>>>>
              (timed_mutex *buy_mx,
              multiset<std::pair<ToyStoreProduct,_int>,_std::less<std::pair<ToyStoreProduct,_int>_>,_std::allocator<std::pair<ToyStoreProduct,_int>_>_>
              *shop,string *shopname,int *budget,int threadid)

{
  bool bVar1;
  int iVar2;
  const_iterator __position;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  uint7 uVar7;
  ulong uVar6;
  unique_lock<std::timed_mutex> buy_lock;
  unique_lock<std::timed_mutex> local_58;
  ulong local_48;
  timed_mutex *local_40;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  uVar6 = 0;
  local_40 = buy_mx;
  do {
    if ((uVar6 & 1) != 0) {
      return 0;
    }
    local_58._M_device = local_40;
    local_58._M_owns = false;
    local_38.__r = 100;
    bVar1 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                      (&local_58,&local_38);
    if (bVar1) {
      uVar5 = (shop->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      uVar7 = (uint7)(uint3)((uint)threadid >> 8);
      local_48 = uVar6;
      if (uVar5 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[T ",3);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,threadid);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"] no more products in this shop",0x1f);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        uVar6 = CONCAT71(uVar7,1);
        std::ostream::flush();
      }
      else {
        __position._M_node = (shop->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar2 = rand();
        uVar5 = (ulong)(long)iVar2 % uVar5;
        if ((long)uVar5 < 1) {
          for (; uVar5 != 0; uVar5 = uVar5 + 1) {
            __position._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
          }
        }
        else {
          do {
            __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        iVar2 = *budget - *(int *)&__position._M_node[1].field_0x4;
        if (iVar2 == 0 || *budget < *(int *)&__position._M_node[1].field_0x4) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[T ",3);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,threadid);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] budget exhausted",0x12);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          uVar6 = CONCAT71(uVar7,1);
          std::ostream::flush();
        }
        else {
          *budget = iVar2;
          std::
          _Rb_tree<std::pair<ToyStoreProduct,int>,std::pair<ToyStoreProduct,int>,std::_Identity<std::pair<ToyStoreProduct,int>>,std::less<std::pair<ToyStoreProduct,int>>,std::allocator<std::pair<ToyStoreProduct,int>>>
          ::erase_abi_cxx11_((_Rb_tree<std::pair<ToyStoreProduct,int>,std::pair<ToyStoreProduct,int>,std::_Identity<std::pair<ToyStoreProduct,int>>,std::less<std::pair<ToyStoreProduct,int>>,std::allocator<std::pair<ToyStoreProduct,int>>>
                              *)shop,__position);
          uVar6 = local_48;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[T ",3);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,threadid);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(shopname->_M_dataplus)._M_p,shopname->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"] bought item, new budget ",0x1a);
          plVar4 = (long *)std::ostream::operator<<(poVar3,*budget);
          std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
          std::ostream::put((char)plVar4);
          std::ostream::flush();
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[T ",3);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,threadid);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(shopname->_M_dataplus)._M_p,shopname->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] timeout",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    std::unique_lock<std::timed_mutex>::~unique_lock(&local_58);
  } while (bVar1);
  return 1;
}

Assistant:

int shopping(std::timed_mutex& buy_mx, shop_t& shop,
             const std::string& shopname, int& budget, const int threadid) {
  bool checkout = false;

  while (!checkout) {
    // try to buy things, but only if shop is not empty

    // be careful, erase modifies the shop, hence lock here
    std::unique_lock<std::timed_mutex> buy_lock(buy_mx, std::defer_lock);

    if (!buy_lock.try_lock_for(std::chrono::milliseconds(PATIENCE))) {
      std::cout << "[T " << threadid << ", " << shopname << "] timeout"
                << std::endl;
      return TIMEOUT;
    }

    size_t size = shop.size();
    if (size != 0) {
      auto elit = shop.begin();
      // find random product in shop
      std::advance(elit, (std::rand() % size));
      if (std::get<1>(*elit) < budget) {
        budget -= std::get<1>(*elit);

        // remove item from shop
        shop.erase(elit);
        std::cout << "[T " << threadid << ", " << shopname
                  << "] bought item, new budget " << budget << std::endl;
      } else {
        std::cout << "[T " << threadid << "] budget exhausted" << std::endl;
        checkout = true;
      }
    } else {
      std::cout << "[T " << threadid << "] no more products in this shop"
                << std::endl;
      checkout = true;
    }
  }
  return CHECKOUT;
}